

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void libtorrent::aux::expand_unspecified_address
               (span<const_libtorrent::aux::ip_interface> ifs,
               span<const_libtorrent::aux::ip_route> routes,
               vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *eps)

{
  span<const_libtorrent::aux::ip_route> routes_00;
  anon_class_16_2_b5407a27_for__M_pred __pred;
  ip_interface *__args;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var1;
  bool bVar2;
  int fam;
  iterator iVar3;
  iterator iVar4;
  ulong uVar5;
  int *__args_1;
  string *__args_2;
  transport *__args_3;
  ip_route *this;
  difference_type extraout_RDX;
  span<const_libtorrent::aux::ip_route> routes_01;
  byte local_19e;
  byte local_19b;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_17d;
  undefined1 local_17c;
  uchar local_17b;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_17a;
  bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> local_179;
  ip_route *local_178;
  ip_route *piStack_170;
  string_view local_168;
  ip_route *local_158;
  ip_route *piStack_150;
  undefined4 local_140;
  uint local_13c;
  uint local_138 [3];
  uint local_12c;
  byte local_125;
  undefined4 local_124;
  bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void> bStack_120;
  bool local;
  uint local_11c;
  ip_interface *local_118;
  listen_endpoint_t *local_110;
  listen_endpoint_t *local_108;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  local_100;
  ip_interface *local_f8;
  ip_interface *ipface;
  ip_interface *__end3;
  ip_interface *__begin3;
  span<const_libtorrent::aux::ip_interface> *__range3;
  reference plStack_d0;
  bool v4;
  listen_endpoint_t *uep;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *__range2;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  allocator<libtorrent::aux::listen_endpoint_t> local_79;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  local_78;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  local_70;
  undefined1 local_68 [8];
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  unspecified_eps;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  local_38;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  unspecified_begin;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *eps_local;
  span<const_libtorrent::aux::ip_route> routes_local;
  span<const_libtorrent::aux::ip_interface> ifs_local;
  
  routes_local.m_len = (difference_type)ifs.m_ptr;
  routes_local.m_ptr = (ip_route *)routes.m_len;
  this = routes.m_ptr;
  unspecified_begin._M_current = (listen_endpoint_t *)eps;
  iVar3 = ::std::
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          ::begin(eps);
  iVar4 = ::std::
          vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          ::end(unspecified_begin._M_current);
  local_70 = ::std::
             partition<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__0>
                       (iVar3._M_current,iVar4._M_current);
  local_38 = local_70;
  local_78._M_current =
       (listen_endpoint_t *)
       ::std::
       vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
       ::end(unspecified_begin._M_current);
  ::std::allocator<libtorrent::aux::listen_endpoint_t>::allocator(&local_79);
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,void>
            ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)local_68,local_70,local_78,&local_79);
  ::std::allocator<libtorrent::aux::listen_endpoint_t>::~allocator(&local_79);
  _Var1 = unspecified_begin;
  __gnu_cxx::
  __normal_iterator<libtorrent::aux::listen_endpoint_t_const*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>
  ::__normal_iterator<libtorrent::aux::listen_endpoint_t*>
            ((__normal_iterator<libtorrent::aux::listen_endpoint_t_const*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>
              *)&local_98,&local_38);
  local_a8._M_current =
       (listen_endpoint_t *)
       ::std::
       vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
       ::end(unspecified_begin._M_current);
  __gnu_cxx::
  __normal_iterator<libtorrent::aux::listen_endpoint_t_const*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>
  ::__normal_iterator<libtorrent::aux::listen_endpoint_t*>
            ((__normal_iterator<libtorrent::aux::listen_endpoint_t_const*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>
              *)&local_a0,&local_a8);
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  erase((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
         *)_Var1._M_current,local_98,local_a0);
  __end2 = ::std::
           vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           ::begin((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                    *)local_68);
  uep = (listen_endpoint_t *)
        ::std::
        vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        ::end((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *)local_68);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
                                     *)&uep), bVar2) {
    plStack_d0 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
                 ::operator*(&__end2);
    __range3._7_1_ = boost::asio::ip::address::is_v4(&plStack_d0->addr);
    __begin3 = (ip_interface *)&routes_local.m_len;
    __end3 = span<const_libtorrent::aux::ip_interface>::begin
                       ((span<const_libtorrent::aux::ip_interface> *)__begin3);
    ipface = span<const_libtorrent::aux::ip_interface>::end
                       ((span<const_libtorrent::aux::ip_interface> *)__begin3);
    for (; __end3 != ipface; __end3 = __end3 + 1) {
      local_f8 = __end3;
      if ((((__end3->preferred & 1U) != 0) &&
          (bVar2 = boost::asio::ip::address::is_v4(&__end3->interface_address),
          bVar2 == (bool)(__range3._7_1_ & 1))) &&
         ((uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) != 0 ||
          (bVar2 = ::std::operator!=(&plStack_d0->device,local_f8->name), !bVar2)))) {
        local_100._M_current =
             (listen_endpoint_t *)
             ::std::
             vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ::begin(unspecified_begin._M_current);
        local_108 = (listen_endpoint_t *)
                    ::std::
                    vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                    ::end(unspecified_begin._M_current);
        local_118 = local_f8;
        local_110 = plStack_d0;
        __pred.uep = plStack_d0;
        __pred.ipface = local_f8;
        bVar2 = ::std::
                any_of<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                          (local_100,
                           (__normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
                            )local_108,__pred);
        if ((!bVar2) && ((local_f8->state == up || (local_f8->state == unknown)))) {
          bStack_120.m_val = (local_f8->flags).m_val;
          local_124 = 1;
          local_11c = (uint)libtorrent::flags::operator&
                                      (bStack_120,
                                       (bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void>
                                        )0x1);
          bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)&local_11c);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            bVar2 = boost::asio::ip::address::is_loopback(&local_f8->interface_address);
            local_19b = 1;
            if (!bVar2) {
              bVar2 = is_link_local(&local_f8->interface_address);
              local_19b = 1;
              if (!bVar2) {
                local_138[2] = (local_f8->flags).m_val;
                local_138[1] = 4;
                local_12c = (uint)libtorrent::flags::operator&
                                            ((bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void>
                                              )local_138[2],
                                             (bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void>
                                              )0x4);
                bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                                  ((bitfield_flag *)&local_12c);
                local_19b = 1;
                if (!bVar2) {
                  bVar2 = is_global(&local_f8->interface_address);
                  local_19e = 0;
                  if (!bVar2) {
                    local_13c = (local_f8->flags).m_val;
                    local_140 = 8;
                    local_138[0] = (uint)libtorrent::flags::operator&
                                                   ((
                                                  bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void>
                                                  )local_13c,
                                                  (
                                                  bitfield_flag<unsigned_int,_libtorrent::aux::interface_flags_tag,_void>
                                                  )0x8);
                    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                                      ((bitfield_flag *)local_138);
                    local_19e = 0;
                    if (!bVar2) {
                      piStack_150 = routes_local.m_ptr;
                      routes_01.m_len = extraout_RDX;
                      routes_01.m_ptr = routes_local.m_ptr;
                      local_158 = this;
                      bVar2 = has_any_internet_route((aux *)this,routes_01);
                      local_19e = 0;
                      if (bVar2) {
                        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (&local_168,local_f8->name);
                        fam = family(&local_f8->interface_address);
                        piStack_170 = routes_local.m_ptr;
                        routes_00.m_len = (difference_type)routes_local.m_ptr;
                        routes_00.m_ptr = this;
                        local_178 = this;
                        bVar2 = has_internet_route(local_168,fam,routes_00);
                        local_19e = bVar2 ^ 0xff;
                      }
                    }
                  }
                  local_19b = local_19e;
                }
              }
            }
            _Var1._M_current = unspecified_begin._M_current;
            __args = local_f8;
            local_125 = local_19b & 1;
            __args_1 = &plStack_d0->port;
            __args_2 = &plStack_d0->device;
            __args_3 = &plStack_d0->ssl;
            local_17b = (plStack_d0->flags).m_val;
            local_17c = 4;
            local_17a = libtorrent::flags::operator|
                                  (local_17b,
                                   (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                    )0x4);
            if ((local_125 & 1) == 0) {
              libtorrent::flags::
              bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>::
              bitfield_flag(&local_17d);
            }
            else {
              local_17d.m_val = '\x02';
            }
            local_179 = libtorrent::flags::operator|(local_17a,local_17d);
            ::std::
            vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
            ::
            emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                      ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                        *)_Var1._M_current,&__args->interface_address,__args_1,__args_2,__args_3,
                       &local_179);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
    ::operator++(&__end2);
  }
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  ~vector((vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           *)local_68);
  return;
}

Assistant:

void expand_unspecified_address(span<ip_interface const> const ifs
		, span<ip_route const> const routes
		, std::vector<listen_endpoint_t>& eps)
	{
		auto unspecified_begin = std::partition(eps.begin(), eps.end()
			, [](listen_endpoint_t const& ep) { return !ep.addr.is_unspecified(); });
		std::vector<listen_endpoint_t> unspecified_eps(unspecified_begin, eps.end());
		eps.erase(unspecified_begin, eps.end());
		for (auto const& uep : unspecified_eps)
		{
			bool const v4 = uep.addr.is_v4();
			for (auto const& ipface : ifs)
			{
				if (!ipface.preferred)
					continue;
				if (ipface.interface_address.is_v4() != v4)
					continue;
				if (!uep.device.empty() && uep.device != ipface.name)
					continue;
				if (std::any_of(eps.begin(), eps.end(), [&](listen_endpoint_t const& e)
				{
					// ignore device name because we don't want to create
					// duplicates if the user explicitly configured an address
					// without a device name
					return e.addr == ipface.interface_address
						&& e.port == uep.port
						&& e.ssl == uep.ssl;
				}))
				{
					continue;
				}

				// ignore interfaces that are down
				if (ipface.state != if_state::up && ipface.state != if_state::unknown)
					continue;
				if (!(ipface.flags & if_flags::up))
					continue;

				// we assume this listen_socket_t is local-network under some
				// conditions, meaning we won't announce it to internet trackers
				// if "routes" does not contain a single route to the internet,
				// we don't use the last case. On MacOS, we can be notified of
				// network changes *before* the routing table is updated
				bool const local
					= ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address)
					|| (ipface.flags & if_flags::loopback)
					|| (!is_global(ipface.interface_address)
						&& !(ipface.flags & if_flags::pointopoint)
						&& has_any_internet_route(routes)
						&& !has_internet_route(ipface.name, family(ipface.interface_address), routes));

				eps.emplace_back(ipface.interface_address, uep.port, uep.device
					, uep.ssl, uep.flags | listen_socket_t::was_expanded
					| (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}